

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(unsigned_long lhs,
         SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         rhs)

{
  bool bVar1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  unsigned_long ret;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_22;
  char local_21;
  unsigned_long local_20;
  unsigned_long local_18;
  
  local_22.m_int = 0;
  local_20 = lhs;
  bVar1 = DivisionCornerCaseHelper<signed_char,_unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
          ::DivisionCornerCase1(lhs,rhs,&local_22);
  if (bVar1) {
    local_18 = (unsigned_long)(byte)local_22.m_int;
  }
  else {
    local_18 = 0;
    local_21 = rhs.m_int;
    DivisionHelper<unsigned_long,signed_char,1>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (&local_20,&local_21,&local_18);
    if (0x7f < local_18) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )(char)local_18;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}